

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint __thiscall llvm::dwarf::getAttributeEncoding(dwarf *this,StringRef EncodingString)

{
  StringRef S;
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  dwarf *local_40;
  char *local_38;
  StringSwitch<unsigned_int,_unsigned_int> local_30;
  dwarf *local_18;
  StringRef EncodingString_local;
  
  local_38 = EncodingString.Data;
  S.Length = (size_t)local_38;
  S.Data = (char *)this;
  local_40 = this;
  local_18 = this;
  EncodingString_local.Data = local_38;
  StringSwitch<unsigned_int,_unsigned_int>::StringSwitch(&local_30,S);
  StringLiteral::StringLiteral<15UL>((StringLiteral *)&local_50,(char (*) [15])"DW_ATE_address");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_30,(StringLiteral)local_50,1);
  StringLiteral::StringLiteral<15UL>((StringLiteral *)&local_60,(char (*) [15])"DW_ATE_boolean");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_60,2);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_70,(char (*) [21])"DW_ATE_complex_float");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_70,3);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_80,(char (*) [13])"DW_ATE_float");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_80,4);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_90,(char (*) [14])"DW_ATE_signed");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_90,5);
  StringLiteral::StringLiteral<19UL>((StringLiteral *)&local_a0,(char (*) [19])"DW_ATE_signed_char")
  ;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_a0,6);
  StringLiteral::StringLiteral<16UL>((StringLiteral *)&local_b0,(char (*) [16])"DW_ATE_unsigned");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_b0,7);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_c0,(char (*) [21])"DW_ATE_unsigned_char");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_c0,8);
  StringLiteral::StringLiteral<23UL>
            ((StringLiteral *)&local_d0,(char (*) [23])"DW_ATE_imaginary_float");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_d0,9);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_e0,(char (*) [22])"DW_ATE_packed_decimal");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_e0,10);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_f0,(char (*) [22])"DW_ATE_numeric_string");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_f0,0xb);
  StringLiteral::StringLiteral<14UL>((StringLiteral *)&local_100,(char (*) [14])"DW_ATE_edited");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_100,0xc);
  StringLiteral::StringLiteral<20UL>
            ((StringLiteral *)&local_110,(char (*) [20])"DW_ATE_signed_fixed");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_110,0xd);
  StringLiteral::StringLiteral<22UL>
            ((StringLiteral *)&local_120,(char (*) [22])"DW_ATE_unsigned_fixed");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_120,0xe);
  StringLiteral::StringLiteral<21UL>
            ((StringLiteral *)&local_130,(char (*) [21])"DW_ATE_decimal_float");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_130,0xf);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_140,(char (*) [11])"DW_ATE_UTF");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_140,0x10);
  StringLiteral::StringLiteral<11UL>((StringLiteral *)&local_150,(char (*) [11])"DW_ATE_UCS");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_150,0x11);
  StringLiteral::StringLiteral<13UL>((StringLiteral *)&local_160,(char (*) [13])"DW_ATE_ASCII");
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,(StringLiteral)local_160,0x12);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getAttributeEncoding(StringRef EncodingString) {
  return StringSwitch<unsigned>(EncodingString)
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  .Case("DW_ATE_" #NAME, DW_ATE_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}